

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint _c;
  Mat *pMVar5;
  void *pvVar6;
  pointer pMVar7;
  undefined1 auVar8 [12];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  uint _h;
  ulong uVar13;
  int iVar14;
  void *pvVar15;
  long lVar16;
  undefined8 *puVar17;
  pointer pRVar18;
  undefined8 *puVar19;
  long lVar20;
  long lVar21;
  void *pvVar22;
  ulong uVar23;
  pointer pRVar24;
  int j;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  void *pvVar28;
  value_type_conflict2 *__x;
  bool bVar29;
  float fVar30;
  float fVar31;
  float fVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  int local_234;
  Mat pbs;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  Mat proposals;
  void *local_150;
  vector<float,_std::allocator<float>_> scores;
  vector<int,_std::allocator<int>_> picked;
  float local_e8;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar27 = pMVar5->w;
  uVar4 = pMVar5->h;
  _c = (this->anchors).h;
  proposals.dims = 0;
  proposals.w = 0;
  proposals.h = 0;
  proposals.c = 0;
  proposals.cstep = 0;
  proposals.elemsize = 0;
  proposals.allocator = (Allocator *)0x0;
  proposals.data = (void *)0x0;
  proposals.refcount = (int *)0x0;
  _h = uVar4 * uVar27;
  uVar23 = 0;
  Mat::create(&proposals,4,_h,_c,4,(Allocator *)0x0);
  uVar9 = 0;
  if (0 < (int)uVar27) {
    uVar9 = (ulong)uVar27;
  }
  this_00 = pMVar5 + 1;
  uVar13 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar13 = uVar23;
  }
  uVar10 = 0;
  if (0 < (int)_c) {
    uVar10 = (ulong)_c;
  }
  lVar16 = (long)(int)uVar27 * 4;
  for (; uVar23 != uVar10; uVar23 = uVar23 + 1) {
    uVar27 = (int)uVar23 * 4;
    Mat::channel(&pbs,this_00,uVar27);
    local_150 = pbs.data;
    Mat::~Mat(&pbs);
    Mat::channel(&pbs,this_00,uVar27 | 1);
    pvVar15 = pbs.data;
    Mat::~Mat(&pbs);
    Mat::channel(&pbs,this_00,uVar27 | 2);
    pvVar22 = pbs.data;
    Mat::~Mat(&pbs);
    Mat::channel(&pbs,this_00,uVar27 | 3);
    pvVar28 = pbs.data;
    Mat::~Mat(&pbs);
    lVar21 = (long)proposals.w;
    pbs.data = (void *)(proposals.cstep * uVar23 * proposals.elemsize + (long)proposals.data);
    pbs.refcount = (int *)0x0;
    pbs.elemsize = proposals.elemsize;
    pbs.allocator = proposals.allocator;
    pbs.dims = 2;
    pbs.w = proposals.w;
    pbs.h = proposals.h;
    pbs.c = 1;
    pbs.cstep = (size_t)(proposals.h * proposals.w);
    pvVar6 = (this->anchors).data;
    lVar20 = (long)(int)uVar23 * (long)(this->anchors).w;
    uVar2 = *(undefined8 *)((long)pvVar6 + lVar20 * 4);
    local_e8 = (float)((ulong)uVar2 >> 0x20);
    uVar3 = *(undefined8 *)((long)pvVar6 + lVar20 * 4 + 8);
    fVar36 = (float)uVar3 - (float)uVar2;
    fVar37 = (float)((ulong)uVar3 >> 0x20) - local_e8;
    iVar14 = this->feat_stride;
    fVar35 = fVar37 * 0.5;
    puVar19 = (undefined8 *)(proposals.cstep * proposals.elemsize * uVar23 + (long)proposals.data);
    for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
      iVar25 = this->feat_stride;
      fVar38 = *(float *)((long)pvVar6 + lVar20 * 4);
      puVar17 = puVar19;
      for (uVar26 = 0; uVar9 != uVar26; uVar26 = uVar26 + 1) {
        fVar31 = *(float *)((long)pvVar28 + uVar26 * 4);
        fVar39 = *(float *)((long)local_150 + uVar26 * 4);
        fVar40 = *(float *)((long)pvVar15 + uVar26 * 4);
        fVar30 = expf(*(float *)((long)pvVar22 + uVar26 * 4));
        fVar31 = expf(fVar31);
        fVar39 = (fVar39 + 0.5) * fVar36 + fVar38;
        fVar40 = (fVar40 + 0.5) * fVar37 + local_e8;
        fVar30 = fVar30 * fVar36 * 0.5;
        fVar31 = fVar31 * fVar35;
        auVar32._4_4_ = fVar31;
        auVar32._0_4_ = fVar30;
        auVar32._8_4_ = fVar39;
        auVar32._12_4_ = fVar40;
        auVar8._4_8_ = auVar32._8_8_;
        auVar8._0_4_ = fVar31 + local_e8 * fVar35;
        auVar33._0_8_ = auVar8._0_8_ << 0x20;
        auVar33._8_4_ = fVar39 + fVar30;
        auVar33._12_4_ = fVar40 + fVar31;
        *puVar17 = CONCAT44(fVar40 - fVar31,fVar39 - fVar30);
        puVar17[1] = auVar33._8_8_;
        fVar38 = fVar38 + (float)iVar25;
        puVar17 = (undefined8 *)((long)puVar17 + lVar21 * 4);
      }
      local_e8 = local_e8 + (float)iVar14;
      pvVar28 = (void *)((long)pvVar28 + lVar16);
      pvVar22 = (void *)((long)pvVar22 + lVar16);
      pvVar15 = (void *)((long)pvVar15 + lVar16);
      local_150 = (void *)((long)local_150 + lVar16);
      puVar19 = (undefined8 *)((long)puVar19 + lVar16 * lVar21);
    }
    Mat::~Mat(&pbs);
  }
  fVar35 = (float)*pMVar5[2].data;
  fVar36 = (float)((ulong)*pMVar5[2].data >> 0x20);
  uVar23 = 0;
  uVar9 = (ulong)_h;
  if ((int)_h < 1) {
    uVar9 = uVar23;
  }
  for (; uVar23 != uVar10; uVar23 = uVar23 + 1) {
    pbs.data = (void *)(proposals.cstep * uVar23 * proposals.elemsize + (long)proposals.data);
    pbs.refcount = (int *)0x0;
    pbs.elemsize = proposals.elemsize;
    pbs.allocator = proposals.allocator;
    pbs.dims = 2;
    pbs.w = proposals.w;
    pbs.h = proposals.h;
    pbs.c = 1;
    pbs.cstep = (size_t)(proposals.h * proposals.w);
    pauVar12 = (undefined1 (*) [16])
               (proposals.cstep * proposals.elemsize * uVar23 + (long)proposals.data);
    uVar13 = uVar9;
    while (bVar29 = uVar13 != 0, uVar13 = uVar13 - 1, bVar29) {
      auVar34._4_4_ = fVar35 + -1.0;
      auVar34._0_4_ = fVar36 + -1.0;
      auVar34._8_4_ = fVar36 + -1.0;
      auVar34._12_4_ = fVar35 + -1.0;
      auVar34 = minps(*pauVar12,auVar34);
      auVar34 = maxps(auVar34,ZEXT816(0));
      *pauVar12 = auVar34;
      pauVar12 = (undefined1 (*) [16])(*pauVar12 + (long)proposals.w * 4);
    }
    Mat::~Mat(&pbs);
  }
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  fVar35 = (float)this->min_size * *(float *)((long)pMVar5[2].data + 8);
  for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
    pbs.data = (void *)(proposals.cstep * uVar23 * proposals.elemsize + (long)proposals.data);
    pbs.refcount = (int *)0x0;
    pbs.elemsize = proposals.elemsize;
    pbs.allocator = proposals.allocator;
    pbs.dims = 2;
    pbs.w = proposals.w;
    pbs.h = proposals.h;
    pbs.c = 1;
    pbs.cstep = (size_t)(proposals.h * proposals.w);
    Mat::channel((Mat *)&picked,pMVar5,_c + (int)uVar23);
    __x = (value_type_conflict2 *)
          picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    Mat::~Mat((Mat *)&picked);
    for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
      lVar16 = (long)(int)uVar13 * (long)pbs.w;
      fVar36 = *(float *)((long)pbs.data + lVar16 * 4);
      if ((fVar35 <= (*(float *)((long)pbs.data + lVar16 * 4 + 8) + 1.0) - fVar36) &&
         (fVar35 <= (*(float *)((long)pbs.data + lVar16 * 4 + 0xc) + 1.0) -
                    *(float *)((long)pbs.data + lVar16 * 4 + 4))) {
        picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(*(undefined4 *)((long)pbs.data + lVar16 * 4 + 4),fVar36);
        picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)CONCAT44(*(undefined4 *)((long)pbs.data + lVar16 * 4 + 0xc),
                                      *(undefined4 *)((long)pbs.data + lVar16 * 4 + 8));
        std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::push_back
                  (&proposal_boxes,(value_type *)&picked);
        std::vector<float,_std::allocator<float>_>::push_back(&scores,__x);
      }
      __x = __x + 1;
    }
    Mat::~Mat(&pbs);
  }
  if (proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start !=
      proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      qsort_descent_inplace<ncnn::Rect>
                (&proposal_boxes,&scores,0,
                 (int)((ulong)((long)scores.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)scores.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                    .super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar14 = this->pre_nms_topN;
  if ((0 < (long)iVar14) &&
     (iVar14 < (int)((ulong)((long)proposal_boxes.
                                   super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)proposal_boxes.
                                  super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4))) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&proposal_boxes,(long)iVar14);
    std::vector<float,_std::allocator<float>_>::resize(&scores,(long)this->pre_nms_topN);
  }
  picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  fVar35 = this->nms_thresh;
  uVar23 = (ulong)((long)proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 4;
  iVar14 = (int)uVar23;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&pbs,(long)iVar14,(allocator_type *)&local_234
            );
  lVar16 = 0;
  uVar9 = 0;
  if (0 < iVar14) {
    uVar9 = uVar23 & 0xffffffff;
  }
  for (; uVar9 * 4 != lVar16; lVar16 = lVar16 + 4) {
    *(float *)((long)pbs.data + lVar16) =
         ((float)((ulong)*(undefined8 *)
                          (&(proposal_boxes.
                             super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                             super__Vector_impl_data._M_start)->x2 + lVar16) >> 0x20) -
         (float)((ulong)*(undefined8 *)
                         (&(proposal_boxes.
                            super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                            super__Vector_impl_data._M_start)->x1 + lVar16) >> 0x20)) *
         ((float)*(undefined8 *)
                  (&(proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                     _M_impl.super__Vector_impl_data._M_start)->x2 + lVar16) -
         (float)*(undefined8 *)
                 (&(proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                    _M_impl.super__Vector_impl_data._M_start)->x1 + lVar16));
  }
  for (local_234 = 0; local_234 < iVar14; local_234 = local_234 + 1) {
    pRVar18 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_start + local_234;
    uVar23 = (ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar9 = uVar23 & 0xffffffff;
    if ((int)uVar23 < 1) {
      uVar9 = 0;
    }
    uVar23 = 1;
    for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
      lVar16 = (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
      fVar36 = pRVar18->x1;
      fVar37 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16].x2;
      fVar38 = 0.0;
      if (fVar36 <= fVar37) {
        pRVar24 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                  .super__Vector_impl_data._M_start + lVar16;
        fVar31 = pRVar18->x2;
        fVar39 = pRVar24->x1;
        if (fVar39 <= fVar31) {
          fVar40 = pRVar18->y1;
          fVar30 = pRVar24->y2;
          if (fVar40 <= fVar30) {
            fVar1 = pRVar18->y2;
            fVar41 = pRVar24->y1;
            if (fVar41 <= fVar1) {
              if (fVar31 <= fVar37) {
                fVar37 = fVar31;
              }
              if (fVar39 <= fVar36) {
                fVar39 = fVar36;
              }
              if (fVar1 <= fVar30) {
                fVar30 = fVar1;
              }
              if (fVar41 <= fVar40) {
                fVar41 = fVar40;
              }
              fVar38 = (fVar30 - fVar41) * (fVar37 - fVar39);
            }
          }
        }
      }
      if (fVar35 < fVar38 / ((*(float *)((long)pbs.data + (long)local_234 * 4) - fVar38) +
                            *(float *)((long)pbs.data + lVar16 * 4))) {
        uVar23 = 0;
      }
    }
    if ((int)uVar23 != 0) {
      std::vector<int,_std::allocator<int>_>::push_back(&picked,&local_234);
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&pbs);
  uVar9 = (ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar23 = uVar9 & 0xffffffff;
  if (this->after_nms_topN < (int)uVar9) {
    uVar23 = (ulong)(uint)this->after_nms_topN;
  }
  pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar14 = (int)uVar23;
  Mat::create(pMVar5,4,1,iVar14,4,(Allocator *)0x0);
  if ((pMVar5->data == (void *)0x0) || ((long)pMVar5->c * pMVar5->cstep == 0)) {
    iVar25 = -100;
  }
  else {
    uVar13 = 0;
    uVar9 = 0;
    if (0 < iVar14) {
      uVar9 = uVar23;
    }
    for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
      Mat::channel(&pbs,pMVar5,(int)uVar13);
      pvVar6 = pbs.data;
      Mat::~Mat(&pbs);
      iVar25 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar13];
      *(float *)pvVar6 =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[iVar25].x1;
      *(float *)((long)pvVar6 + 4) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[iVar25].y1;
      *(float *)((long)pvVar6 + 8) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[iVar25].x2;
      *(float *)((long)pvVar6 + 0xc) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[iVar25].y2;
    }
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar25 = 0;
    if (1 < (ulong)(((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) / 0x38)) {
      pMVar5 = pMVar7 + 1;
      Mat::create(pMVar5,1,1,iVar14,4,(Allocator *)0x0);
      if (pMVar5->data == (void *)0x0) {
        iVar25 = -100;
      }
      else {
        iVar25 = -100;
        if ((long)pMVar7[1].c * pMVar7[1].cstep != 0) {
          iVar25 = 0;
          for (uVar23 = 0; uVar9 != uVar23; uVar23 = uVar23 + 1) {
            Mat::channel(&pbs,pMVar5,(int)uVar23);
            pvVar6 = pbs.data;
            Mat::~Mat(&pbs);
            *(float *)pvVar6 =
                 scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar23]];
          }
        }
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&picked.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&scores.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>::~_Vector_base
            (&proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>);
  Mat::~Mat(&proposals);
  return iVar25;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * exp(dw);
                float pb_h = anchor_h * exp(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<int> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}